

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix<Rational> __thiscall
Matrix<Rational>::joinHorizontal(Matrix<Rational> *this,Matrix<Rational> *a)

{
  matrix_error *this_00;
  uint *in_RDX;
  Rational *extraout_RDX;
  Rational *extraout_RDX_00;
  Rational *pRVar1;
  Rational *extraout_RDX_01;
  uint j;
  ulong uVar2;
  uint i;
  uint uVar3;
  long lVar4;
  Matrix<Rational> MVar5;
  
  if (a->M == *in_RDX) {
    Matrix(this,a->M,in_RDX[1] + a->N);
    pRVar1 = extraout_RDX;
    for (uVar3 = 0; uVar3 < a->M; uVar3 = uVar3 + 1) {
      lVar4 = 0;
      for (uVar2 = 0; uVar2 < a->N; uVar2 = uVar2 + 1) {
        Rational::operator=((Rational *)
                            ((long)&this->arr[this->N * uVar3]._numerator.digits.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar4),
                            (Rational *)
                            ((long)&a->arr[a->N * uVar3]._numerator.digits.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar4));
        lVar4 = lVar4 + 0x40;
        pRVar1 = extraout_RDX_00;
      }
      lVar4 = 0;
      for (uVar2 = 0; uVar2 < in_RDX[1]; uVar2 = uVar2 + 1) {
        Rational::operator=(this->arr + (ulong)(this->N * uVar3) + (ulong)(a->N + (int)uVar2),
                            (Rational *)
                            ((ulong)(in_RDX[1] * uVar3) * 0x40 + *(long *)(in_RDX + 2) + lVar4));
        lVar4 = lVar4 + 0x40;
        pRVar1 = extraout_RDX_01;
      }
    }
    MVar5.arr = pRVar1;
    MVar5._0_8_ = this;
    return MVar5;
  }
  this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
  matrix_error::runtime_error(this_00,"Trying to join matrices of different height");
  __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Matrix<Field> Matrix<Field>::joinHorizontal(const Matrix &a) const
{
    if(M != a.M)
    {
        throw matrix_error("Trying to join matrices of different height");
    }
    Matrix res(M, N + a.N);
    for(unsigned i = 0; i < M; i++)
    {
        for(unsigned j = 0; j < N; j++)
        {
            res[i][j] = (*this)[i][j];
        }
        for(unsigned j = 0; j < a.N; j++)
        {
            res[i][N + j] = a[i][j];
        }
    }
    return res;
}